

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

char * modTimeToStr(PHYSFS_sint64 modtime,char *modstr,size_t strsize)

{
  char *__src;
  char *str;
  time_t t;
  size_t strsize_local;
  char *modstr_local;
  PHYSFS_sint64 modtime_local;
  
  t = strsize;
  strsize_local = (size_t)modstr;
  modstr_local = (char *)modtime;
  if (modtime < 0) {
    strncpy(modstr,"Unknown\n",strsize);
  }
  else {
    str = (char *)modtime;
    __src = ctime((time_t *)&str);
    strncpy((char *)strsize_local,__src,t);
  }
  *(undefined1 *)(strsize_local + t + -1) = 0;
  return (char *)strsize_local;
}

Assistant:

static char* modTimeToStr(PHYSFS_sint64 modtime, char *modstr, size_t strsize)
{
    if (modtime < 0)
        strncpy(modstr, "Unknown\n", strsize);
    else
    {
        time_t t = (time_t) modtime;
        char *str = ctime(&t);
        strncpy(modstr, str, strsize);
    } /* else */

    modstr[strsize-1] = '\0';
    return modstr;
}